

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O1

Pass * wasm::createSSAifyPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x90);
  pPVar1->runner = (PassRunner *)0x0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  (pPVar1->passArg).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  pPVar1->_vptr_Pass = (_func_int **)&PTR__SSAify_01096498;
  *(undefined1 *)&pPVar1[1]._vptr_Pass = 1;
  pPVar1[1].name._M_string_length = 0;
  pPVar1[1].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pPVar1[1].name.field_2 + 1) = 0;
  *(undefined8 *)((long)&pPVar1[1].name.field_2 + 9) = 0;
  return pPVar1;
}

Assistant:

Pass* createSSAifyPass() { return new SSAify(true); }